

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O0

Grammar * __thiscall
xercesc_4_0::DGXMLScanner::loadDTDGrammar(DGXMLScanner *this,InputSource *src,bool toCache)

{
  XMLValidator *pXVar1;
  DocTypeHandler *pDVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  DTDGrammar *pDVar6;
  XMLStringPool *pXVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  RuntimeException *pRVar8;
  undefined4 extraout_var_02;
  DTDEntityDecl *this_00;
  undefined4 extraout_var_03;
  DTDElementDecl *this_01;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined1 local_d8 [8];
  DTDScanner dtdScanner;
  Janitor<xercesc_4_0::DTDElementDecl> janSrc;
  DTDElementDecl *rootDecl;
  DTDEntityDecl *declDTD;
  XMLCh gDTDStr [4];
  XMLReader *newReader;
  XMLCh *sysIdStr;
  uint sysId;
  bool toCache_local;
  InputSource *src_local;
  DGXMLScanner *this_local;
  
  (*(this->fDTDValidator->super_XMLValidator)._vptr_XMLValidator[6])();
  if (((this->super_XMLScanner).fValidatorFromUser & 1U) != 0) {
    (*((this->super_XMLScanner).fValidator)->_vptr_XMLValidator[6])();
  }
  pDVar6 = (DTDGrammar *)
           XMemory::operator_new(0x40,(this->super_XMLScanner).fGrammarPoolMemoryManager);
  DTDGrammar::DTDGrammar(pDVar6,(this->super_XMLScanner).fGrammarPoolMemoryManager);
  this->fDTDGrammar = pDVar6;
  GrammarResolver::putGrammar
            ((this->super_XMLScanner).fGrammarResolver,&this->fDTDGrammar->super_Grammar);
  (this->super_XMLScanner).fGrammar = &this->fDTDGrammar->super_Grammar;
  pXVar1 = (this->super_XMLScanner).fValidator;
  (*pXVar1->_vptr_XMLValidator[0xb])(pXVar1,(this->super_XMLScanner).fGrammar);
  if ((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0) {
    (*((this->super_XMLScanner).fDocHandler)->_vptr_XMLDocumentHandler[9])();
  }
  if ((this->super_XMLScanner).fEntityHandler != (XMLEntityHandler *)0x0) {
    (*((this->super_XMLScanner).fEntityHandler)->_vptr_XMLEntityHandler[4])();
  }
  if ((this->super_XMLScanner).fErrorReporter != (XMLErrorReporter *)0x0) {
    (*((this->super_XMLScanner).fErrorReporter)->_vptr_XMLErrorReporter[3])();
  }
  XMLScanner::resetValidationContext(&this->super_XMLScanner);
  if (toCache) {
    pXVar7 = GrammarResolver::getStringPool((this->super_XMLScanner).fGrammarResolver);
    iVar3 = (*src->_vptr_InputSource[5])();
    uVar4 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[5])
                      (pXVar7,CONCAT44(extraout_var,iVar3));
    pXVar7 = GrammarResolver::getStringPool((this->super_XMLScanner).fGrammarResolver);
    iVar3 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[10])(pXVar7,(ulong)uVar4);
    GrammarResolver::orphanGrammar
              ((this->super_XMLScanner).fGrammarResolver,(XMLCh *)XMLUni::fgDTDEntityString);
    iVar5 = (*(((this->super_XMLScanner).fGrammar)->super_XSerializable)._vptr_XSerializable[0x16])
                      ();
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x50))
              ((long *)CONCAT44(extraout_var_00,iVar5),iVar3);
    GrammarResolver::putGrammar
              ((this->super_XMLScanner).fGrammarResolver,(this->super_XMLScanner).fGrammar);
  }
  gDTDStr = (XMLCh  [4])
            ReaderMgr::createReader
                      (&(this->super_XMLScanner).fReaderMgr,src,false,RefFrom_NonLiteral,
                       Type_General,Source_External,
                       (bool)((this->super_XMLScanner).fCalculateSrcOfs & 1),
                       (this->super_XMLScanner).fLowWaterMark);
  if (gDTDStr == (XMLCh  [4])0x0) {
    uVar4 = (*src->_vptr_InputSource[6])();
    if ((uVar4 & 1) == 0) {
      pRVar8 = (RuntimeException *)__cxa_allocate_exception(0x30);
      iVar3 = (*src->_vptr_InputSource[5])();
      RuntimeException::RuntimeException
                (pRVar8,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                 ,0x849,Scan_CouldNotOpenSource_Warning,(XMLCh *)CONCAT44(extraout_var_02,iVar3),
                 (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
      __cxa_throw(pRVar8,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
    }
    pRVar8 = (RuntimeException *)__cxa_allocate_exception(0x30);
    iVar3 = (*src->_vptr_InputSource[5])();
    RuntimeException::RuntimeException
              (pRVar8,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
               ,0x847,Scan_CouldNotOpenSource,(XMLCh *)CONCAT44(extraout_var_01,iVar3),(XMLCh *)0x0,
               (XMLCh *)0x0,(XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
    __cxa_throw(pRVar8,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
  }
  declDTD = (DTDEntityDecl *)0x4400540044;
  this_00 = (DTDEntityDecl *)XMemory::operator_new(0x60,(this->super_XMLScanner).fMemoryManager);
  DTDEntityDecl::DTDEntityDecl
            (this_00,(XMLCh *)&declDTD,false,(this->super_XMLScanner).fMemoryManager);
  iVar3 = (*src->_vptr_InputSource[5])();
  XMLEntityDecl::setSystemId((XMLEntityDecl *)this_00,(XMLCh *)CONCAT44(extraout_var_03,iVar3));
  XMLEntityDecl::setIsExternal((XMLEntityDecl *)this_00,true);
  XMLReader::setThrowAtEnd((XMLReader *)gDTDStr,true);
  ReaderMgr::pushReaderAdoptEntity
            (&(this->super_XMLScanner).fReaderMgr,(XMLReader *)gDTDStr,(XMLEntityDecl *)this_00,true
            );
  if ((this->super_XMLScanner).fDocTypeHandler != (DocTypeHandler *)0x0) {
    this_01 = (DTDElementDecl *)
              XMemory::operator_new(0x58,(this->super_XMLScanner).fGrammarPoolMemoryManager);
    DTDElementDecl::DTDElementDecl
              (this_01,(XMLCh *)&declDTD,(this->super_XMLScanner).fEmptyNamespaceId,Any,
               (this->super_XMLScanner).fGrammarPoolMemoryManager);
    XMLElementDecl::setCreateReason((XMLElementDecl *)this_01,AsRootElem);
    XMLElementDecl::setExternalElemDeclaration((XMLElementDecl *)this_01,true);
    Janitor<xercesc_4_0::DTDElementDecl>::Janitor
              ((Janitor<xercesc_4_0::DTDElementDecl> *)&dtdScanner.fDocTypeReaderId,this_01);
    pDVar2 = (this->super_XMLScanner).fDocTypeHandler;
    iVar3 = (*src->_vptr_InputSource[4])();
    iVar5 = (*src->_vptr_InputSource[5])();
    (*pDVar2->_vptr_DocTypeHandler[4])
              (pDVar2,this_01,CONCAT44(extraout_var_04,iVar3),CONCAT44(extraout_var_05,iVar5),0,1);
    Janitor<xercesc_4_0::DTDElementDecl>::~Janitor
              ((Janitor<xercesc_4_0::DTDElementDecl> *)&dtdScanner.fDocTypeReaderId);
  }
  DTDScanner::DTDScanner
            ((DTDScanner *)local_d8,(DTDGrammar *)(this->super_XMLScanner).fGrammar,
             (this->super_XMLScanner).fDocTypeHandler,
             (this->super_XMLScanner).fGrammarPoolMemoryManager,
             (this->super_XMLScanner).fMemoryManager);
  DTDScanner::setScannerInfo
            ((DTDScanner *)local_d8,&this->super_XMLScanner,&(this->super_XMLScanner).fReaderMgr,
             &(this->super_XMLScanner).fBufMgr);
  DTDScanner::scanExtSubsetDecl((DTDScanner *)local_d8,false,true);
  if (((this->super_XMLScanner).fValidate & 1U) != 0) {
    pXVar1 = (this->super_XMLScanner).fValidator;
    (*pXVar1->_vptr_XMLValidator[4])(pXVar1,0,1);
  }
  if (toCache) {
    GrammarResolver::cacheGrammars((this->super_XMLScanner).fGrammarResolver);
  }
  pDVar6 = this->fDTDGrammar;
  DTDScanner::~DTDScanner((DTDScanner *)local_d8);
  return &pDVar6->super_Grammar;
}

Assistant:

Grammar* DGXMLScanner::loadDTDGrammar(const InputSource& src,
                                      const bool toCache)
{
    // Reset the validators
    fDTDValidator->reset();
    if (fValidatorFromUser)
        fValidator->reset();

    fDTDGrammar = new (fGrammarPoolMemoryManager) DTDGrammar(fGrammarPoolMemoryManager);
    fGrammarResolver->putGrammar(fDTDGrammar);
    fGrammar = fDTDGrammar;
    fValidator->setGrammar(fGrammar);

    //  And for all installed handlers, send reset events. This gives them
    //  a chance to flush any cached data.
    if (fDocHandler)
        fDocHandler->resetDocument();
    if (fEntityHandler)
        fEntityHandler->resetEntities();
    if (fErrorReporter)
        fErrorReporter->resetErrors();

    // Clear out the id reference list
    resetValidationContext();

    if (toCache) {

        unsigned int sysId = fGrammarResolver->getStringPool()->addOrFind(src.getSystemId());
        const XMLCh* sysIdStr = fGrammarResolver->getStringPool()->getValueForId(sysId);

        fGrammarResolver->orphanGrammar(XMLUni::fgDTDEntityString);
        ((XMLDTDDescription*) (fGrammar->getGrammarDescription()))->setSystemId(sysIdStr);
        fGrammarResolver->putGrammar(fGrammar);
    }

    //  Handle the creation of the XML reader object for this input source.
    //  This will provide us with transcoding and basic lexing services.
    XMLReader* newReader = fReaderMgr.createReader
    (
        src
        , false
        , XMLReader::RefFrom_NonLiteral
        , XMLReader::Type_General
        , XMLReader::Source_External
        , fCalculateSrcOfs
        , fLowWaterMark
    );
    if (!newReader) {
        if (src.getIssueFatalErrorIfNotFound())
            ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Scan_CouldNotOpenSource, src.getSystemId(), fMemoryManager);
        else
            ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Scan_CouldNotOpenSource_Warning, src.getSystemId(), fMemoryManager);
    }

    //  In order to make the processing work consistently, we have to
    //  make this look like an external entity. So create an entity
    //  decl and fill it in and push it with the reader, as happens
    //  with an external entity. Put a janitor on it to insure it gets
    //  cleaned up. The reader manager does not adopt them.
    const XMLCh gDTDStr[] = { chLatin_D, chLatin_T, chLatin_D , chNull };
    DTDEntityDecl* declDTD = new (fMemoryManager) DTDEntityDecl(gDTDStr, false, fMemoryManager);
    declDTD->setSystemId(src.getSystemId());
    declDTD->setIsExternal(true);

    // Mark this one as a throw at end
    newReader->setThrowAtEnd(true);

    // And push it onto the stack, with its pseudo name
    fReaderMgr.pushReaderAdoptEntity(newReader, declDTD);

    //  If we have a doc type handler and advanced callbacks are enabled,
    //  call the doctype event.
    if (fDocTypeHandler) {

        // Create a dummy root
        DTDElementDecl* rootDecl = new (fGrammarPoolMemoryManager) DTDElementDecl
        (
            gDTDStr
            , fEmptyNamespaceId
            , DTDElementDecl::Any
            , fGrammarPoolMemoryManager
        );
        rootDecl->setCreateReason(DTDElementDecl::AsRootElem);
        rootDecl->setExternalElemDeclaration(true);
        Janitor<DTDElementDecl> janSrc(rootDecl);

        fDocTypeHandler->doctypeDecl(*rootDecl, src.getPublicId(), src.getSystemId(), false, true);
    }

    // Create DTDScanner
    DTDScanner dtdScanner
    (
        (DTDGrammar*)fGrammar
        , fDocTypeHandler
        , fGrammarPoolMemoryManager
        , fMemoryManager
    );
    dtdScanner.setScannerInfo(this, &fReaderMgr, &fBufMgr);

    // Tell it its not in an include section
    dtdScanner.scanExtSubsetDecl(false, true);

    if (fValidate) {
        //  validate the DTD scan so far
        fValidator->preContentValidation(false, true);
    }

    if (toCache)
        fGrammarResolver->cacheGrammars();

    return fDTDGrammar;
}